

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_depth_clip_state
          (Impl *this,Value *state,VkPipelineRasterizationDepthClipStateCreateInfoEXT **out_info)

{
  uint uVar1;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *pVVar2;
  Type pGVar3;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *info;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPipelineRasterizationDepthClipStateCreateInfoEXT>
                     (&this->allocator);
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->flags = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthClipEnable");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->depthClipEnable = uVar1;
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_depth_clip_state(const Value &state, VkPipelineRasterizationDepthClipStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationDepthClipStateCreateInfoEXT>();

	info->flags = state["flags"].GetUint();
	info->depthClipEnable = state["depthClipEnable"].GetUint();

	*out_info = info;
	return true;
}